

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

ostream * cppcms::filters::streamable::to_string<cppcms::filters::urlencode>(ios *out,void *ptr)

{
  urlencode *in_RDI;
  ostringstream oss;
  urlencode *object;
  urlencode *out_00;
  long local_198 [51];
  
  out_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  operator<<((ostream *)out_00,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return (ostream *)out_00;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}